

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall QTabBarPrivate::slide(QTabBarPrivate *this,int from,int to)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QTabBar *pQVar6;
  const_reference ppTVar7;
  int in_EDX;
  int in_ESI;
  QTabBarPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar8;
  int length;
  int postLocation;
  int preLocation;
  bool vertical;
  QTabBar *q;
  int in_stack_00000058;
  int in_stack_0000005c;
  undefined4 in_stack_ffffffffffffff78;
  undefined1 enable;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int duration;
  int iVar9;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar10;
  QTabBarPrivate *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = q_func(in_RDI);
  iVar4 = (int)((ulong)pQVar6 >> 0x20);
  if (((in_ESI != in_EDX) &&
      (bVar2 = validIndex((QTabBarPrivate *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          (int)((ulong)in_RDI >> 0x20)), bVar2)) &&
     (bVar2 = validIndex((QTabBarPrivate *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (int)((ulong)in_RDI >> 0x20)), bVar2)) {
    bVar2 = verticalTabs(in_RDI->shape);
    enable = (undefined1)((ulong)in_RDI >> 0x38);
    uVar10 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff9c);
    if (bVar2) {
      QTabBar::tabRect((QTabBar *)CONCAT44(in_ESI,in_EDX),iVar4);
      iVar3 = QRect::y((QRect *)0x6b19f1);
    }
    else {
      QTabBar::tabRect((QTabBar *)CONCAT44(in_ESI,in_EDX),iVar4);
      iVar3 = QRect::x((QRect *)0x6b1a19);
    }
    iVar9 = iVar3;
    QWidget::setUpdatesEnabled
              ((QWidget *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(bool)enable
              );
    QTabBar::moveTab((QTabBar *)this,in_stack_0000005c,in_stack_00000058);
    QWidget::setUpdatesEnabled
              ((QWidget *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(bool)enable
              );
    if ((uVar10 & 0x1000000) == 0) {
      QVar8 = QTabBar::tabRect((QTabBar *)CONCAT44(in_ESI,in_EDX),iVar4);
      in_stack_ffffffffffffffb8 = QVar8._0_8_;
      iVar4 = QRect::x((QRect *)0x6b1aa3);
    }
    else {
      QTabBar::tabRect((QTabBar *)CONCAT44(in_ESI,in_EDX),iVar4);
      iVar4 = QRect::y((QRect *)0x6b1a7b);
    }
    iVar5 = iVar4 - iVar9;
    duration = iVar4;
    ppTVar7 = QList<QTabBarPrivate::Tab_*>::at
                        ((QList<QTabBarPrivate::Tab_*> *)CONCAT44(iVar3,iVar4),
                         CONCAT44(iVar5,in_stack_ffffffffffffff78));
    (*ppTVar7)->dragOffset = (*ppTVar7)->dragOffset - iVar5;
    QList<QTabBarPrivate::Tab_*>::at
              ((QList<QTabBarPrivate::Tab_*> *)CONCAT44(iVar3,iVar4),
               CONCAT44(iVar5,in_stack_ffffffffffffff78));
    Tab::startAnimation((Tab *)CONCAT44(uVar10,iVar9),in_stack_ffffffffffffffb8,duration);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabBarPrivate::slide(int from, int to)
{
    Q_Q(QTabBar);
    if (from == to
            || !validIndex(from)
            || !validIndex(to))
        return;
    bool vertical = verticalTabs(shape);
    int preLocation = vertical ? q->tabRect(from).y() : q->tabRect(from).x();
    q->setUpdatesEnabled(false);
    q->moveTab(from, to);
    q->setUpdatesEnabled(true);
    int postLocation = vertical ? q->tabRect(to).y() : q->tabRect(to).x();
    int length = postLocation - preLocation;
    tabList.at(to)->dragOffset -= length;
    tabList.at(to)->startAnimation(this, ANIMATION_DURATION);
}